

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

intptr_t last_active_element(uint64_t *g,intptr_t words,intptr_t esz)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar2 = words + 1;
  lVar3 = words << 6;
  do {
    lVar3 = lVar3 + -0x40;
    uVar4 = g[lVar2 + -2] & pred_esz_masks_aarch64[esz];
    if (uVar4 != 0) {
      uVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      return (uVar1 ^ 0x3f) + lVar3 ^ 0x3f;
    }
    lVar2 = lVar2 + -1;
  } while (1 < lVar2);
  return -1L << ((byte)esz & 0x3f);
}

Assistant:

static intptr_t last_active_element(uint64_t *g, intptr_t words, intptr_t esz)
{
    uint64_t mask = pred_esz_masks[esz];
    intptr_t i = words;

    do {
        uint64_t this_g = g[--i] & mask;
        if (this_g) {
            return i * 64 + (63 - clz64(this_g));
        }
    } while (i > 0);
    return (intptr_t)-1 << esz;
}